

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

int checkivError(GLuint object,GLenum pname,PFNGLGETPROGRAMIVPROC glGetiv,
                PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)

{
  void *pvVar1;
  int in_EAX;
  int iVar2;
  GLchar *__ptr;
  long lVar3;
  char *fmt;
  GLint logsize;
  GLint compile_status;
  int local_38;
  GLint local_34;
  
  local_34 = 1;
  local_38 = in_EAX;
  (*glGetiv)(object,pname,&local_34);
  iVar2 = 0;
  if (local_34 != 1) {
    (*glGetiv)(object,0x8b84,&local_38);
    __ptr = (GLchar *)malloc((long)local_38 + 1);
    if (__ptr == (GLchar *)0x0) {
      checkivError_cold_1();
      lVar3 = 0;
      pvVar1 = libGL;
      while (libGL = pvVar1,
            libGL = (void *)dlopen((long)&open_gl_NAMES_rel +
                                   (long)*(int *)((long)&open_gl_NAMES_rel + lVar3),0x102),
            libGL == (void *)0x0) {
        lVar3 = lVar3 + 4;
        pvVar1 = (void *)0x0;
        if (lVar3 != 4) {
          return 0;
        }
      }
      gladGetProcAddressPtr = (PFNGLXGETPROCADDRESSPROC_PRIVATE)dlsym(libGL,"glXGetProcAddressARB");
      if (gladGetProcAddressPtr == (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) {
        return 0;
      }
      iVar2 = gladLoadGLLoader(get_proc);
      if (libGL != (void *)0x0) {
        dlclose();
        libGL = (void *)0x0;
        return iVar2;
      }
      return iVar2;
    }
    (*glGetInfoLog)(object,local_38,&local_38,__ptr);
    fmt = "%s\t-> compile operation failed";
    if (pname == 0x8b82) {
      fmt = "%s\t-> link operation failed";
    }
    iVar2 = 0x20002;
    bov_error_log(0x20002,fmt,__ptr);
    fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",
            (ulong)((uint)(pname != 0x8b82) * 4 + 0x83));
    free(__ptr);
  }
  return iVar2;
}

Assistant:

static int checkivError(GLuint object, GLenum pname,
                        PFNGLGETPROGRAMIVPROC glGetiv,
                        PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)
{
	GLint compile_status = GL_TRUE;
	glGetiv(object, pname, &compile_status);
	if(compile_status!=GL_TRUE)
	{
		GLint logsize;
		glGetiv(object, GL_INFO_LOG_LENGTH, &logsize);

		char *log = malloc((size_t) logsize + 1);
		CHECK_MALLOC(log);

		glGetInfoLog(object, logsize, &logsize, log);
		if(pname==GL_LINK_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> link operation failed",
			              log);
		else if(pname==GL_COMPILE_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> compile operation failed",
			              log);
		else
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> Unknown object operation failed",
			              log);
		free(log);
		return BOV_SHADER_ERROR;
	}
	return 0;
}